

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O2

void __thiscall LinearScan::SetUses(LinearScan *this,Instr *instr,Opnd *opnd)

{
  byte *pbVar1;
  OpndKind OVar2;
  SymOpnd *pSVar3;
  StackSym *stackSym;
  ListOpnd *pLVar4;
  RegOpnd *regOpnd;
  IndirOpnd *pIVar5;
  int i;
  long lVar6;
  
  OVar2 = IR::Opnd::GetKind(opnd);
  switch(OVar2) {
  case OpndKindIntConst:
  case OpndKindAddr:
    LinearScanMD::LegalizeConstantUse(&this->linearScanMD,instr,opnd);
    return;
  case OpndKindSym:
    pSVar3 = IR::Opnd::AsSymOpnd(opnd);
    if ((pSVar3->m_sym->m_kind == SymKindStack) &&
       (stackSym = Sym::AsStackSym(pSVar3->m_sym), (stackSym->field_0x19 & 0x10) == 0)) {
      Func::StackAllocate(this->func,stackSym,TySize[opnd->m_type]);
      if (stackSym->scratch != (anon_union_8_3_6c1fdb8e_for_scratch)0x0) {
        pbVar1 = (byte *)((long)stackSym->scratch + 0x9d);
        *pbVar1 = *pbVar1 | 0x10;
      }
    }
    break;
  case OpndKindReg:
    regOpnd = IR::Opnd::AsRegOpnd(opnd);
LAB_00533f1b:
    SetUse(this,instr,regOpnd);
    return;
  case OpndKindIndir:
    pIVar5 = IR::Opnd::AsIndirOpnd(opnd);
    if (pIVar5->m_baseOpnd != (RegOpnd *)0x0) {
      SetUse(this,instr,pIVar5->m_baseOpnd);
    }
    regOpnd = pIVar5->m_indexOpnd;
    if (regOpnd != (RegOpnd *)0x0) goto LAB_00533f1b;
    break;
  case OpndKindList:
    pLVar4 = IR::Opnd::AsListOpnd(opnd);
    for (lVar6 = 0; lVar6 < pLVar4->count; lVar6 = lVar6 + 1) {
      SetUses(this,instr,&pLVar4->opnds[lVar6]->super_Opnd);
    }
  }
  return;
}

Assistant:

void
LinearScan::SetUses(IR::Instr *instr, IR::Opnd *opnd)
{
    switch (opnd->GetKind())
    {
    case IR::OpndKindReg:
        this->SetUse(instr, opnd->AsRegOpnd());
        break;

    case IR::OpndKindSym:
        {
            Sym * sym = opnd->AsSymOpnd()->m_sym;
            if (sym->IsStackSym())
            {
                StackSym* stackSym = sym->AsStackSym();
                if (!stackSym->IsAllocated())
                {
                    func->StackAllocate(stackSym, opnd->GetSize());
                    // StackSym's lifetime is allocated during SCCLiveness::ProcessDst
                    // we might not need to set the flag if the sym is not a dst.
                    if (stackSym->scratch.linearScan.lifetime)
                    {
                        stackSym->scratch.linearScan.lifetime->cantStackPack = true;
                    }
                }
                this->linearScanMD.LegalizeUse(instr, opnd);
            }
        }
        break;
    case IR::OpndKindIndir:
        {
            IR::IndirOpnd * indirOpnd = opnd->AsIndirOpnd();

            if (indirOpnd->GetBaseOpnd())
            {
                this->SetUse(instr, indirOpnd->GetBaseOpnd());
            }
            if (indirOpnd->GetIndexOpnd())
            {
                this->SetUse(instr, indirOpnd->GetIndexOpnd());
            }
        }
        break;

    case IR::OpndKindList:
    {
        opnd->AsListOpnd()->Map([&](int i, IR::Opnd* opnd)
        {
            this->SetUses(instr, opnd);
        });
    }
    break;

    case IR::OpndKindIntConst:
    case IR::OpndKindAddr:
        this->linearScanMD.LegalizeConstantUse(instr, opnd);
        break;
    };
}